

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O0

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::CoinSelection::KnapsackSolver
          (CoinSelection *this,int64_t *target_value,
          vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *utxos,uint64_t min_change,
          int64_t *select_value,Amount *utxo_fee_value)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference ppUVar4;
  undefined8 uVar5;
  string *psVar6;
  reference pvVar7;
  reference ppUVar8;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *in_RCX;
  long *in_RDX;
  vector<char,_std::allocator<char>_> *in_RSI;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_RDI;
  long in_R8;
  uint64_t *in_R9;
  Amount AVar9;
  int64_t *in_stack_00000008;
  uint i;
  uint64_t ret_value_1;
  vector<char,_std::allocator<char>_> vf_best2;
  int64_t n_best2;
  int64_t n_best;
  vector<char,_std::allocator<char>_> vf_best;
  Utxo **utxo;
  iterator __end2;
  iterator __begin2;
  vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> *__range2;
  uint64_t ret_value;
  size_t index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  int64_t utxo_fee;
  int64_t n_effective_total_max;
  int64_t n_effective_total;
  vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> applicable_groups;
  Utxo *lowest_larger;
  int64_t n_min_change;
  int64_t n_target;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *ret_utxos;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  value_type *in_stack_fffffffffffffca8;
  string *in_stack_fffffffffffffcb0;
  CfdError in_stack_fffffffffffffcbc;
  CfdException *in_stack_fffffffffffffcc0;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  char *local_2b8;
  int local_2b0;
  int64_t *in_stack_fffffffffffffd58;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd68;
  undefined7 in_stack_fffffffffffffd69;
  int64_t in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd79;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  uint uVar10;
  uint64_t local_278;
  int iterations;
  undefined8 in_stack_fffffffffffffd90;
  long local_230;
  vector<char,_std::allocator<char>_> local_228;
  Utxo **local_208;
  Utxo **local_200;
  size_type local_1f8;
  CfdSourceLocation local_1f0;
  int64_t local_1d8;
  undefined1 local_1d0;
  int64_t local_1c8;
  undefined1 local_1c0;
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [32];
  char *local_190;
  undefined4 local_188;
  char *local_180;
  size_type local_178;
  CfdSourceLocation local_170;
  int64_t local_158;
  undefined1 local_150;
  int64_t local_148;
  undefined1 local_140;
  reference local_138;
  Utxo **local_130;
  __normal_iterator<const_cfd::Utxo_**,_std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>_>
  local_128;
  vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> *local_120;
  uint64_t local_118;
  undefined4 local_10c;
  size_type local_108;
  CfdSourceLocation local_100;
  int64_t local_e8;
  undefined1 local_e0;
  int64_t local_d8;
  undefined1 local_d0;
  ulong local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  long local_a8;
  long local_a0;
  long local_98;
  vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> local_90;
  value_type local_78;
  char *local_60;
  undefined4 local_58;
  char *local_50;
  long local_48;
  long local_40;
  byte local_31;
  uint64_t *local_30;
  long local_28;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *local_20;
  long *local_18;
  
  local_31 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x55ce9f);
  local_40 = *local_18;
  local_48 = local_28;
  local_60 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/cfd_utxo.cpp"
                     ,0x2f);
  local_60 = local_60 + 1;
  local_58 = 0x2f8;
  local_50 = "KnapsackSolver";
  core::logger::info<long&>
            ((CfdSourceLocation *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
             (char *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),(long *)0x55cf14)
  ;
  local_78 = (value_type)0x0;
  std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::vector
            ((vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> *)0x55cf2f);
  local_98 = 0;
  local_a0 = 0;
  local_a8 = 0;
  sVar3 = std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::size(local_20);
  core::RandomNumberUtil::GetRandomIndexes(&local_c0,(uint32_t)sVar3);
  local_c8 = 0;
  do {
    uVar1 = local_c8;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0);
    iterations = (int)in_stack_fffffffffffffd90;
    if (sVar3 <= uVar1) {
      if (local_98 == local_40) {
        local_118 = 0;
        local_120 = &local_90;
        local_128._M_current =
             (Utxo **)std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::begin
                                ((vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> *)
                                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        local_130 = (Utxo **)std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::end
                                       ((vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                                         *)CONCAT44(in_stack_fffffffffffffc9c,
                                                    in_stack_fffffffffffffc98));
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_cfd::Utxo_**,_std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                                  (__normal_iterator<const_cfd::Utxo_**,_std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)),
              bVar2) {
          local_138 = __gnu_cxx::
                      __normal_iterator<const_cfd::Utxo_**,_std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>_>
                      ::operator*(&local_128);
          std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
                    ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffffcb0,
                     in_stack_fffffffffffffca8);
          local_118 = (*local_138)->amount + local_118;
          local_a8 = (*local_138)->fee + local_a8;
          __gnu_cxx::
          __normal_iterator<const_cfd::Utxo_**,_std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>_>
          ::operator++(&local_128);
        }
        *local_30 = local_118;
        AVar9 = core::Amount::CreateBySatoshiAmount(local_a8);
        local_158 = AVar9.amount_;
        local_150 = AVar9.ignore_check_;
        *(undefined1 *)(in_stack_00000008 + 1) = local_150;
        *in_stack_00000008 = local_158;
        local_148 = local_158;
        local_140 = local_150;
        local_170.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/cfd_utxo.cpp"
                     ,0x2f);
        local_170.filename = local_170.filename + 1;
        local_170.line = 0x32a;
        local_170.funcname = "KnapsackSolver";
        local_178 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(in_RDI);
        core::logger::info<unsigned_long>(&local_170,"KnapsackSolver end. results={}",&local_178);
        local_31 = 1;
        local_10c = 1;
      }
      else if (local_a0 < local_40) {
        if (local_78 == (value_type)0x0) {
          local_190 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/cfd_utxo.cpp"
                              ,0x2f);
          local_190 = local_190 + 1;
          local_188 = 0x332;
          local_180 = "KnapsackSolver";
          core::logger::warn<long&,long&>
                    ((CfdSourceLocation *)in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8,
                     (long *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                     (long *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
          local_1b2 = 1;
          uVar5 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1b0,"insufficient funds.",&local_1b1);
          core::CfdException::CfdException
                    (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb0);
          local_1b2 = 0;
          __cxa_throw(uVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
        std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
                  ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffffcb0,
                   in_stack_fffffffffffffca8);
        *local_30 = local_78->amount;
        AVar9 = core::Amount::CreateBySatoshiAmount(local_78->fee);
        local_1d8 = AVar9.amount_;
        local_1d0 = AVar9.ignore_check_;
        *(undefined1 *)(in_stack_00000008 + 1) = local_1d0;
        *in_stack_00000008 = local_1d8;
        local_1c8 = local_1d8;
        local_1c0 = local_1d0;
        local_1f0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/cfd_utxo.cpp"
                     ,0x2f);
        local_1f0.filename = local_1f0.filename + 1;
        local_1f0.line = 0x33b;
        local_1f0.funcname = "KnapsackSolver";
        local_1f8 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(in_RDI);
        core::logger::info<unsigned_long>(&local_1f0,"KnapsackSolver end. results={}",&local_1f8);
        local_31 = 1;
        local_10c = 1;
      }
      else {
        local_200 = (Utxo **)std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::
                             begin((vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> *)
                                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        local_208 = (Utxo **)std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::end
                                       ((vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                                         *)CONCAT44(in_stack_fffffffffffffc9c,
                                                    in_stack_fffffffffffffc98));
        std::
        sort<__gnu_cxx::__normal_iterator<cfd::Utxo_const**,std::vector<cfd::Utxo_const*,std::allocator<cfd::Utxo_const*>>>,cfd::CoinSelection::KnapsackSolver(long_const&,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>const&,unsigned_long,long*,cfd::core::Amount*)::__0>
                  (local_200,local_208);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)0x55d7b4);
        std::vector<bool,_std::allocator<bool>_>::clear
                  ((vector<bool,_std::allocator<bool>_> *)
                   &(in_RSI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x8);
        ApproximateBestSubset
                  ((CoinSelection *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   (vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> *)
                   CONCAT71(in_stack_fffffffffffffd79,in_stack_fffffffffffffd78),
                   in_stack_fffffffffffffd70,
                   CONCAT71(in_stack_fffffffffffffd69,in_stack_fffffffffffffd68),
                   in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,iterations);
        if ((local_230 != local_40) && (local_40 + local_48 <= local_a0)) {
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)0x55d85b);
          ApproximateBestSubset
                    ((CoinSelection *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     (vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> *)
                     CONCAT71(in_stack_fffffffffffffd79,in_stack_fffffffffffffd78),
                     in_stack_fffffffffffffd70,
                     CONCAT71(in_stack_fffffffffffffd69,in_stack_fffffffffffffd68),
                     in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,iterations);
          if (local_230 == local_40) {
            std::vector<char,_std::allocator<char>_>::operator=(in_stack_fffffffffffffd40,in_RSI);
          }
          std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffcb0);
        }
        if ((local_78 == (value_type)0x0) ||
           (((local_230 == local_40 || (local_40 + local_48 <= local_230)) &&
            (local_230 < local_78->effective_k_value)))) {
          local_278 = 0;
          uVar10 = 0;
          while( true ) {
            in_stack_fffffffffffffcb0 = (string *)(ulong)uVar10;
            psVar6 = (string *)
                     std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::size
                               (&local_90);
            if (psVar6 <= in_stack_fffffffffffffcb0) break;
            pvVar7 = std::vector<char,_std::allocator<char>_>::operator[](&local_228,(ulong)uVar10);
            if (*pvVar7 != '\0') {
              std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::operator[]
                        (&local_90,(ulong)uVar10);
              std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
                        ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffffcb0,
                         in_stack_fffffffffffffca8);
              ppUVar8 = std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::
                        operator[](&local_90,(ulong)uVar10);
              local_278 = (*ppUVar8)->amount + local_278;
              ppUVar8 = std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::
                        operator[](&local_90,(ulong)uVar10);
              local_a8 = (*ppUVar8)->fee + local_a8;
            }
            uVar10 = uVar10 + 1;
          }
          *local_30 = local_278;
          AVar9 = core::Amount::CreateBySatoshiAmount(local_a8);
          *in_stack_00000008 = AVar9.amount_;
          *(bool *)(in_stack_00000008 + 1) = AVar9.ignore_check_;
        }
        else {
          std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
                    ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffffcb0,
                     in_stack_fffffffffffffca8);
          *local_30 = local_78->amount;
          AVar9 = core::Amount::CreateBySatoshiAmount(local_78->fee);
          *in_stack_00000008 = AVar9.amount_;
          *(bool *)(in_stack_00000008 + 1) = AVar9.ignore_check_;
        }
        local_2b8 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/cfd_utxo.cpp"
                            ,0x2f);
        local_2b8 = local_2b8 + 1;
        local_2b0 = 0x36d;
        std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(in_RDI);
        core::logger::info<unsigned_long>
                  ((CfdSourceLocation *)&local_2b8,"KnapsackSolver end. results={}",
                   (unsigned_long *)&stack0xfffffffffffffd40);
        local_31 = 1;
        local_10c = 1;
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffcb0);
      }
LAB_0055dc57:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcb0);
      std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::~vector
                ((vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> *)
                 in_stack_fffffffffffffcb0);
      if ((local_31 & 1) == 0) {
        std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector
                  ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffffcb0);
      }
      return in_RDI;
    }
    ppUVar4 = std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::operator[](local_20,local_c8);
    if ((*ppUVar4)->effective_k_value == local_40) {
      std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::operator[](local_20,local_c8);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffffcb0,
                 in_stack_fffffffffffffca8);
      ppUVar4 = std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::operator[]
                          (local_20,local_c8);
      *local_30 = (*ppUVar4)->amount;
      ppUVar4 = std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::operator[]
                          (local_20,local_c8);
      AVar9 = core::Amount::CreateBySatoshiAmount((*ppUVar4)->fee);
      local_e8 = AVar9.amount_;
      local_e0 = AVar9.ignore_check_;
      *(undefined1 *)(in_stack_00000008 + 1) = local_e0;
      *in_stack_00000008 = local_e8;
      local_d8 = local_e8;
      local_d0 = local_e0;
      local_100.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/cfd_utxo.cpp"
                   ,0x2f);
      local_100.filename = local_100.filename + 1;
      local_100.line = 0x30c;
      local_100.funcname = "KnapsackSolver";
      local_108 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(in_RDI);
      core::logger::info<unsigned_long>(&local_100,"KnapsackSolver end. results={}",&local_108);
      local_31 = 1;
      local_10c = 1;
      goto LAB_0055dc57;
    }
    ppUVar4 = std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::operator[](local_20,local_c8);
    if ((*ppUVar4)->effective_k_value < local_40 + local_48) {
      std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::operator[](local_20,local_c8);
      std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::push_back
                ((vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> *)
                 in_stack_fffffffffffffcb0,(value_type *)in_stack_fffffffffffffca8);
      ppUVar4 = std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::operator[]
                          (local_20,local_c8);
      if (0 < (*ppUVar4)->effective_k_value) {
        ppUVar4 = std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::operator[]
                            (local_20,local_c8);
        local_a0 = (*ppUVar4)->effective_k_value + local_a0;
      }
      ppUVar4 = std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::operator[]
                          (local_20,local_c8);
      local_98 = (*ppUVar4)->effective_k_value + local_98;
    }
    else if ((local_78 == (value_type)0x0) ||
            (ppUVar4 = std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::operator[]
                                 (local_20,local_c8), (*ppUVar4)->amount < local_78->amount)) {
      ppUVar4 = std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::operator[]
                          (local_20,local_c8);
      local_78 = *ppUVar4;
    }
    local_c8 = local_c8 + 1;
  } while( true );
}

Assistant:

std::vector<Utxo> CoinSelection::KnapsackSolver(
    const int64_t& target_value, const std::vector<Utxo*>& utxos,
    uint64_t min_change, int64_t* select_value, Amount* utxo_fee_value) {
  std::vector<Utxo> ret_utxos;
  int64_t n_target = target_value;
  int64_t n_min_change = static_cast<int64_t>(min_change);
  info(CFD_LOG_SOURCE, "KnapsackSolver start. target={}", n_target);

  // List of values less than target
  const Utxo* lowest_larger = nullptr;
  std::vector<const Utxo*> applicable_groups;
  // int64_t n_total = 0;
  int64_t n_effective_total = 0;  // amount excluding fee
  int64_t n_effective_total_max = 0;
  int64_t utxo_fee = 0;

  std::vector<uint32_t> indexes =
      RandomNumberUtil::GetRandomIndexes(static_cast<uint32_t>(utxos.size()));

  for (size_t index = 0; index < indexes.size(); ++index) {
    // if (utxos[index]->amount == n_target) {
    if (utxos[index]->effective_k_value == n_target) {
      // that meets the required value
      ret_utxos.push_back(*utxos[index]);
      *select_value = utxos[index]->amount;
      *utxo_fee_value = Amount::CreateBySatoshiAmount(utxos[index]->fee);
      info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
      return ret_utxos;

    } else if (utxos[index]->effective_k_value < n_target + n_min_change) {
      // } else if ((utxos[index]->amount < n_target + min_change) {
      applicable_groups.push_back(utxos[index]);
      // n_total += utxos[index]->amount;
      if (utxos[index]->effective_k_value > 0) {
        n_effective_total_max += utxos[index]->effective_k_value;
      }
      n_effective_total += utxos[index]->effective_k_value;

    } else if (
        lowest_larger == nullptr ||
        utxos[index]->amount < lowest_larger->amount) {
      // greater than `n_target + min_change`
      lowest_larger = utxos[index];
    }
  }

  // if (n_total == n_target) {
  if (n_effective_total == n_target) {
    uint64_t ret_value = 0;
    for (const auto& utxo : applicable_groups) {
      ret_utxos.push_back(*utxo);
      ret_value += utxo->amount;
      utxo_fee += utxo->fee;
    }
    *select_value = static_cast<int64_t>(ret_value);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(utxo_fee);
    info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
    return ret_utxos;
  }

  // if (n_total < n_target) {
  if (n_effective_total_max < n_target) {
    if (lowest_larger == nullptr) {
      warn(
          CFD_LOG_SOURCE, "insufficient funds. effective_total:{} target:{}",
          n_effective_total, n_target);
      throw CfdException(
          CfdError::kCfdIllegalStateError, "insufficient funds.");
    }

    ret_utxos.push_back(*lowest_larger);
    *select_value = static_cast<int64_t>(lowest_larger->amount);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(lowest_larger->fee);
    info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
    return ret_utxos;
  }

  std::sort(
      applicable_groups.begin(), applicable_groups.end(),
      [](const Utxo* a, const Utxo* b) {
        return a->effective_k_value > b->effective_k_value;
      });
  std::vector<char> vf_best;
  int64_t n_best;

  randomize_cache_.clear();
  ApproximateBestSubset(
      applicable_groups, n_effective_total_max, n_target, &vf_best, &n_best,
      kApproximateBestSubsetIterations);
  if (n_best != n_target && n_effective_total_max >= n_target + n_min_change) {
    int64_t n_best2 = n_best;
    std::vector<char> vf_best2;
    ApproximateBestSubset(
        applicable_groups, n_effective_total_max, (n_target + n_min_change),
        &vf_best2, &n_best2, kApproximateBestSubsetIterations);
    if ((n_best2 == n_target) || (n_best > n_best2)) {
      n_best = n_best2;
      vf_best = vf_best2;
    }
  }

  // NOLINT If we have a bigger coin and (either the stochastic approximation didn't find a good solution,
  // NOLINT                                or the next bigger coin is closer), return the bigger coin
  if (lowest_larger != nullptr &&
      ((n_best != n_target && n_best < n_target + n_min_change) ||
       lowest_larger->effective_k_value <= n_best)) {
    // lowest_larger->amount <= n_best)) {
    ret_utxos.push_back(*lowest_larger);
    *select_value = static_cast<int64_t>(lowest_larger->amount);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(lowest_larger->fee);

  } else {
    uint64_t ret_value = 0;
    for (unsigned int i = 0; i < applicable_groups.size(); i++) {
      if (vf_best[i]) {
        ret_utxos.push_back(*applicable_groups[i]);
        ret_value += applicable_groups[i]->amount;
        utxo_fee += applicable_groups[i]->fee;
      }
    }
    *select_value = static_cast<int64_t>(ret_value);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(utxo_fee);
  }
  info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
  return ret_utxos;
}